

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editions_test.cc
# Opt level: O0

void __thiscall EditionsTest_PlainField_Test::TestBody(EditionsTest_PlainField_Test *this)

{
  bool bVar1;
  upb_DefPool *s;
  upb_MessageDef *ptr;
  char *message;
  char *in_R9;
  string local_88;
  AssertHelper local_68;
  Message local_60;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  FieldDefPtr f;
  MessageDefPtr local_28;
  MessageDefPtr md;
  DefPool defpool;
  EditionsTest_PlainField_Test *this_local;
  
  upb::DefPool::DefPool((DefPool *)&md);
  s = upb::DefPool::ptr((DefPool *)&md);
  ptr = upb_test_2023_EditionsMessage_getmsgdef(s);
  upb::MessageDefPtr::MessageDefPtr(&local_28,ptr);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )upb::MessageDefPtr::FindFieldByName(&local_28,"plain_field");
  local_51 = upb::FieldDefPtr::has_presence((FieldDefPtr *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_50,(AssertionResult *)"f.has_presence()","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/editions_test.cc"
               ,0x13,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  upb::DefPool::~DefPool((DefPool *)&md);
  return;
}

Assistant:

TEST(EditionsTest, PlainField) {
  upb::DefPool defpool;
  upb::MessageDefPtr md(upb_test_2023_EditionsMessage_getmsgdef(defpool.ptr()));
  upb::FieldDefPtr f(md.FindFieldByName("plain_field"));
  EXPECT_TRUE(f.has_presence());
}